

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

void NULLCMemory::read_into_short_array(NULLCArray buffer,int offset,NULLCArray result)

{
  bool bVar1;
  int in_R9D;
  NULLCArray buffer_00;
  
  buffer_00.ptr._4_4_ = (undefined4)((ulong)register0x00000030 >> 0x20);
  buffer_00.ptr._0_4_ = buffer.len;
  if (result.ptr == (char *)0x0) {
    nullcThrowError("buffer is empty");
    return;
  }
  buffer_00.len = offset;
  bVar1 = check_access((NULLCMemory *)buffer.ptr,buffer_00,1,result.len,in_R9D);
  if (bVar1) {
    memcpy(result.ptr,(NULLCMemory *)buffer.ptr + offset,(ulong)result.len * 2);
    return;
  }
  return;
}

Assistant:

void read_into_short_array(NULLCArray buffer, int offset, NULLCArray result)
	{
		if(!result.ptr)
		{
			nullcThrowError("buffer is empty");
			return;
		}

		if(!check_access(buffer, offset, 1, result.len))
			return;

		memcpy(result.ptr, buffer.ptr + offset, sizeof(short) * result.len);
	}